

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FlattenTo2DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_flattento2d(NeuralNetworkLayer *this)

{
  bool bVar1;
  FlattenTo2DLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_flattento2d(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_flattento2d(this);
    this_00 = (FlattenTo2DLayerParams *)operator_new(0x20);
    FlattenTo2DLayerParams::FlattenTo2DLayerParams(this_00);
    (this->layer_).flattento2d_ = this_00;
  }
  return (FlattenTo2DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenTo2DLayerParams* NeuralNetworkLayer::mutable_flattento2d() {
  if (!has_flattento2d()) {
    clear_layer();
    set_has_flattento2d();
    layer_.flattento2d_ = new ::CoreML::Specification::FlattenTo2DLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.flattenTo2D)
  return layer_.flattento2d_;
}